

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMemory.c
# Opt level: O0

void Extra_MmFixedStop(Extra_MmFixed_t *p)

{
  int local_14;
  int i;
  Extra_MmFixed_t *p_local;
  
  if (p != (Extra_MmFixed_t *)0x0) {
    for (local_14 = 0; local_14 < p->nChunks; local_14 = local_14 + 1) {
      if (p->pChunks[local_14] != (char *)0x0) {
        free(p->pChunks[local_14]);
        p->pChunks[local_14] = (char *)0x0;
      }
    }
    if (p->pChunks != (char **)0x0) {
      free(p->pChunks);
      p->pChunks = (char **)0x0;
    }
    if (p != (Extra_MmFixed_t *)0x0) {
      free(p);
    }
  }
  return;
}

Assistant:

void Extra_MmFixedStop( Extra_MmFixed_t * p )
{
    int i;
    if ( p == NULL )
        return;
    for ( i = 0; i < p->nChunks; i++ )
        ABC_FREE( p->pChunks[i] );
    ABC_FREE( p->pChunks );
    ABC_FREE( p );
}